

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

int __thiscall
glslang::HlslParseContext::findSubtreeOffset(HlslParseContext *this,TIntermNode *node)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer ppVar5;
  _Self local_48;
  key_type_conflict2 local_40;
  _Self local_38;
  const_iterator flattenData;
  int subset;
  TIntermSymbol *sym;
  TIntermNode *node_local;
  HlslParseContext *this_local;
  TIntermSymbol *this_00;
  
  iVar2 = (*node->_vptr_TIntermNode[0x18])();
  this_00 = (TIntermSymbol *)CONCAT44(extraout_var,iVar2);
  if (this_00 == (TIntermSymbol *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    uVar3 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x2a])();
    if (((uVar3 & 1) == 0) &&
       (uVar3 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x2d])(),
       (uVar3 & 1) == 0)) {
      return 0;
    }
    flattenData._M_node._4_4_ = TIntermSymbol::getFlattenSubset(this_00);
    if (flattenData._M_node._4_4_ == -1) {
      this_local._4_4_ = 0;
    }
    else {
      iVar2 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
      local_40 = CONCAT44(extraout_var_00,iVar2);
      local_38._M_node =
           (_Base_ptr)
           std::
           map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
           ::find(&(this->flattenMap).
                   super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
                  ,&local_40);
      local_48._M_node =
           (_Base_ptr)
           std::
           map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
           ::end(&(this->flattenMap).
                  super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
                );
      bVar1 = std::operator==(&local_38,&local_48);
      if (bVar1) {
        this_local._4_4_ = 0;
      }
      else {
        iVar4 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
        iVar2 = flattenData._M_node._4_4_;
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>
                 ::operator->(&local_38);
        this_local._4_4_ =
             findSubtreeOffset(this,(TType *)CONCAT44(extraout_var_01,iVar4),iVar2,
                               &(ppVar5->second).offsets);
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int HlslParseContext::findSubtreeOffset(const TIntermNode& node) const
{
    const TIntermSymbol* sym = node.getAsSymbolNode();
    if (sym == nullptr)
        return 0;
    if (!sym->isArray() && !sym->isStruct())
        return 0;
    int subset = sym->getFlattenSubset();
    if (subset == -1)
        return 0;

    // Getting this far means a partial aggregate is identified by the flatten subset.
    // Find the first leaf of the subset.

    const auto flattenData = flattenMap.find(sym->getId());
    if (flattenData == flattenMap.end())
        return 0;

    return findSubtreeOffset(sym->getType(), subset, flattenData->second.offsets);

    do {
        subset = flattenData->second.offsets[subset];
    } while (true);
}